

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O0

int luaB_load(lua_State *L)

{
  int iVar1;
  char *chunkname;
  char *cname;
  int status;
  lua_State *L_local;
  
  chunkname = luaL_optlstring(L,2,"=(load)",(size_t *)0x0);
  luaL_checktype(L,1,6);
  lua_settop(L,3);
  iVar1 = lua_load(L,generic_reader,(void *)0x0,chunkname);
  iVar1 = load_aux(L,iVar1);
  return iVar1;
}

Assistant:

static int luaB_load (lua_State *L) {
  int status;
  const char *cname = luaL_optstring(L, 2, "=(load)");
  luaL_checktype(L, 1, LUA_TFUNCTION);
  lua_settop(L, 3);  /* function, eventual name, plus one reserved slot */
  status = lua_load(L, generic_reader, NULL, cname);
  return load_aux(L, status);
}